

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_4afdb9::ConversionOperatorType::printLeft
          (ConversionOperatorType *this,OutputStream *S)

{
  StringView R;
  
  R.Last = "";
  R.First = "operator ";
  OutputStream::operator+=(S,R);
  Node::print(this->Ty,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "operator ";
    Ty->print(S);
  }